

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  const_reference ppLVar5;
  undefined8 *in_RCX;
  vector<float,_std::allocator<float>_> *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  Mat top_blob_g_1;
  Option opt_g_2;
  int p_1;
  Mat top_blob_g;
  Mat top_blob_tm_g;
  Option opt_g_1;
  int p;
  Mat top_blob_tm;
  int outh;
  int outw;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  size_t elemsize;
  int channels;
  int h;
  int w;
  conv_int8_requant_func conv_int8_requant;
  conv_int8_dequant_func conv_int8_dequant;
  conv_func conv;
  conv_int8_requant_func conv_int8_requant_func_table [7] [4];
  conv_int8_dequant_func conv_int8_dequant_func_table [7] [4];
  conv_func conv_func_table [7] [4];
  int stride;
  int kernel_size;
  Option *in_stack_000006e0;
  Mat *in_stack_000006e8;
  Mat *in_stack_000006f0;
  Mat *in_stack_000006f8;
  Mat *in_stack_00000700;
  Option *in_stack_00000b40;
  Mat *in_stack_00000b48;
  Mat *in_stack_00000b50;
  Convolution *in_stack_00000b58;
  int in_stack_00000d48;
  int in_stack_00000d4c;
  Mat *in_stack_00000d50;
  Mat *in_stack_00000d58;
  Mat *in_stack_00000d60;
  Mat *in_stack_00000d68;
  int in_stack_00001c10;
  int in_stack_00001c18;
  Option *in_stack_00001c20;
  Mat *in_stack_fffffffffffff930;
  Mat *in_stack_fffffffffffff938;
  int in_stack_fffffffffffff940;
  int in_stack_fffffffffffff944;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  Mat *in_stack_fffffffffffff950;
  code *pcVar6;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff978;
  vector<float,_std::allocator<float>_> *pvVar7;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff980;
  vector<float,_std::allocator<float>_> *pvVar8;
  undefined1 local_640 [24];
  undefined1 local_628 [64];
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  pointer pfStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  int local_5b4;
  undefined1 local_5b0 [24];
  undefined1 local_598 [64];
  undefined1 local_558 [64];
  undefined4 local_518;
  undefined4 uStack_514;
  pointer pfStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  int local_4e4;
  Mat local_4e0;
  int local_4a0;
  int local_49c;
  undefined1 local_498 [48];
  undefined1 local_468 [48];
  undefined1 local_438 [92];
  int local_3dc;
  int local_3d8;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  Allocator *pAStack_3c0;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined8 local_3a8;
  uint local_398;
  Mat local_388;
  Mat local_348;
  size_t local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  vector<float,_std::allocator<float>_> *local_2f0;
  code *local_2e8;
  long local_2e0;
  long local_2d8 [28];
  undefined8 local_1f8 [28];
  long local_118 [29];
  int local_30;
  int local_2c;
  undefined8 *local_28;
  vector<float,_std::allocator<float>_> *local_20;
  Mat *local_18;
  int local_4;
  
  if (in_RSI->dims != 3) {
    iVar4 = Convolution::forward
                      (in_stack_00000b58,in_stack_00000b50,in_stack_00000b48,in_stack_00000b40);
    return iVar4;
  }
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) !=
       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88)) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) !=
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98))) {
    iVar4 = Convolution::forward
                      (in_stack_00000b58,in_stack_00000b50,in_stack_00000b48,in_stack_00000b40);
    return iVar4;
  }
  local_2c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84);
  local_30 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94);
  if (((7 < local_2c) || (7 < local_30)) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) !=
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90))) {
    iVar4 = Convolution::forward
                      (in_stack_00000b58,in_stack_00000b50,in_stack_00000b48,in_stack_00000b40);
    return iVar4;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memcpy(local_118,&PTR_conv1x1s1_sse_001e0c90,0xe0);
  memcpy(local_1f8,&PTR_conv1x1s1_int8_dequant_sse_001e0d70,0xe0);
  memcpy(local_2d8,&PTR_conv1x1s1_int8_requant_sse_001e0e50,0xe0);
  local_2e0 = 0;
  local_2e8 = (code *)0x0;
  local_2f0 = (vector<float,_std::allocator<float>_> *)0x0;
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c8) & 1) == 0) {
    local_2e0 = local_118[(long)(local_2c + -1) * 4 + (long)(local_30 + -1)];
    if (local_2e0 == 0) {
      iVar4 = Convolution::forward
                        (in_stack_00000b58,in_stack_00000b50,in_stack_00000b48,in_stack_00000b40);
      return iVar4;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) != 1) {
      if (local_30 != 1) {
        iVar4 = Convolution::forward
                          (in_stack_00000b58,in_stack_00000b50,in_stack_00000b48,in_stack_00000b40);
        return iVar4;
      }
      iVar4 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_20,local_2e0,local_28);
      return iVar4;
    }
  }
  else {
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c9) & 1) == 0) {
      local_2e8 = (code *)local_1f8[(long)(local_2c + -1) * 4 + (long)(local_30 + -1)];
    }
    else {
      local_2f0 = (vector<float,_std::allocator<float>_> *)
                  local_2d8[(long)(local_2c + -1) * 4 + (long)(local_30 + -1)];
    }
    if ((local_2f0 == (vector<float,_std::allocator<float>_> *)0x0) && (local_2e8 == (code *)0x0)) {
      iVar4 = Convolution::forward
                        (in_stack_00000b58,in_stack_00000b50,in_stack_00000b48,in_stack_00000b40);
      return iVar4;
    }
  }
  local_2f4 = local_18->w;
  local_2f8 = local_18->h;
  local_2fc = local_18->c;
  local_308 = local_18->elemsize;
  Mat::Mat(&local_348,local_18);
  if (((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c8) & 1) != 0) && (local_308 != 1))
  {
    Mat::Mat(&local_388);
    Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                in_stack_fffffffffffff944,(size_t)in_stack_fffffffffffff938,
                (Allocator *)in_stack_fffffffffffff930);
    bVar3 = Mat::empty(in_stack_fffffffffffff930);
    if (bVar3) {
      local_4 = -100;
    }
    else {
      local_3a8 = local_28[4];
      local_3c8 = *(undefined4 *)local_28;
      uStack_3c4 = *(undefined4 *)((long)local_28 + 4);
      local_3b8 = *(undefined4 *)(local_28 + 2);
      uStack_3b4 = *(undefined4 *)((long)local_28 + 0x14);
      uStack_3b0 = *(undefined4 *)(local_28 + 3);
      uStack_3ac = *(undefined4 *)((long)local_28 + 0x1c);
      pAStack_3c0 = local_388.allocator;
      plVar1 = *(long **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d0);
      (**(code **)(*plVar1 + 0x38))(plVar1,local_18,&local_388,&local_3c8);
      Mat::operator=(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    }
    local_398 = (uint)bVar3;
    Mat::~Mat((Mat *)0x13c149);
    if (local_398 != 0) goto LAB_0013d04e;
  }
  Mat::Mat((Mat *)(local_438 + 0x30),&local_348);
  if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) < 1) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) < 1)) &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) < 1)) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) < 1)) {
    if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) == -0xe9) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) == -0xe9)) &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) == -0xe9 &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) == -0xe9)))) {
      local_468._44_4_ = (local_2c + ((local_2f4 + -1) / local_30) * local_30) - local_2f4;
      local_468._40_4_ = (local_2c + ((local_2f8 + -1) / local_30) * local_30) - local_2f8;
      if ((0 < (int)local_468._44_4_) || (0 < (int)local_468._40_4_)) {
        local_468._32_8_ = local_28[4];
        local_468._0_8_ = *local_28;
        local_468._16_8_ = local_28[2];
        local_468._24_8_ = local_28[3];
        local_468._8_8_ = local_28[2];
        in_stack_fffffffffffff930 = (Mat *)local_468;
        copy_make_border((Mat *)opt_b_1._0_8_,_hpad_1,opt_b_2._36_4_,opt_b_2._32_4_,opt_b_2._28_4_,
                         opt_b_2._24_4_,(int)opt_b_1.workspace_allocator,
                         opt_b_2.workspace_allocator._4_4_,(Option *)opt_b_1._24_8_);
        bVar3 = Mat::empty(in_stack_fffffffffffff930);
        if (bVar3) {
          local_4 = -100;
          local_398 = 1;
          goto LAB_0013d030;
        }
      }
      local_2f4 = local_3dc;
      local_2f8 = local_3d8;
    }
    else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) == -0xea) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) == -0xea)) &&
            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) == -0xea &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) == -0xea)))) {
      local_498._44_4_ = (local_2c + ((local_2f4 + -1) / local_30) * local_30) - local_2f4;
      local_498._40_4_ = (local_2c + ((local_2f8 + -1) / local_30) * local_30) - local_2f8;
      if ((0 < (int)local_498._44_4_) || (0 < (int)local_498._40_4_)) {
        local_498._32_8_ = local_28[4];
        local_498._0_8_ = *local_28;
        local_498._16_8_ = local_28[2];
        local_498._24_8_ = local_28[3];
        local_498._8_8_ = local_28[2];
        in_stack_fffffffffffff930 = (Mat *)local_498;
        copy_make_border((Mat *)opt_b_1._0_8_,_hpad_1,opt_b_2._36_4_,opt_b_2._32_4_,opt_b_2._28_4_,
                         opt_b_2._24_4_,(int)opt_b_1.workspace_allocator,
                         opt_b_2.workspace_allocator._4_4_,(Option *)opt_b_1._24_8_);
        bVar3 = Mat::empty(in_stack_fffffffffffff930);
        if (bVar3) {
          local_4 = -100;
          local_398 = 1;
          goto LAB_0013d030;
        }
      }
      local_2f4 = local_3dc;
      local_2f8 = local_3d8;
    }
LAB_0013c739:
    local_49c = (local_2f4 - local_2c) / local_30 + 1;
    local_4a0 = (local_2f8 - local_2c) / local_30 + 1;
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c8) & 1) == 0) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                  in_stack_fffffffffffff944,(size_t)in_stack_fffffffffffff938,
                  (Allocator *)in_stack_fffffffffffff930);
      bVar3 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar3) {
        local_4 = -100;
        local_398 = 1;
      }
      else {
        if ((((*(byte *)(in_RDI + 2) & 1) == 0) || (local_49c < 8)) || (local_4a0 < 8)) {
          conv_im2col_sgemm_sse
                    (in_stack_00000d68,in_stack_00000d60,in_stack_00000d58,in_stack_00000d50,
                     in_stack_00000d4c,in_stack_00000d48,in_stack_00001c10,in_stack_00001c18,
                     in_stack_00001c20);
        }
        else {
          conv3x3s1_winograd23_sse
                    (in_stack_00000700,in_stack_000006f8,in_stack_000006f0,in_stack_000006e8,
                     in_stack_000006e0);
        }
        if (in_RDI[1] != 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
        }
        local_4 = 0;
        local_398 = 1;
      }
    }
    else if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c9) & 1) == 1) {
      Mat::Mat(&local_4e0);
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                  in_stack_fffffffffffff944,(size_t)in_stack_fffffffffffff938,
                  (Allocator *)in_stack_fffffffffffff930);
      bVar3 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar3) {
        local_4 = -100;
        local_398 = 1;
      }
      else {
        Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                    in_stack_fffffffffffff944,(size_t)in_stack_fffffffffffff938,
                    (Allocator *)in_stack_fffffffffffff930);
        bVar3 = Mat::empty(in_stack_fffffffffffff930);
        if (bVar3) {
          local_4 = -100;
          local_398 = 1;
        }
        else {
          if ((*(byte *)(in_RDI + 2) & 1) == 0) {
            lVar2 = *(long *)(*in_RDI + -0x18);
            pvVar7 = local_2f0;
            pvVar8 = local_20;
            std::vector<float,_std::allocator<float>_>::vector(local_20,local_2f0);
            (*(code *)pvVar7)(local_438 + 0x30,pvVar8,(long)in_RDI + lVar2 + 0x100,
                              (long)in_RDI + lVar2 + 0x140,local_5b0,local_28);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
          }
          else {
            conv3x3s1_winograd43_int8_sse
                      ((Mat *)top_blob_tm_g._48_8_,(Mat *)top_blob_tm_g._40_8_,
                       (Mat *)top_blob_tm_g.allocator,(Option *)top_blob_tm_g._24_8_);
            for (local_4e4 = 0;
                local_4e4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80);
                local_4e4 = local_4e4 + 1) {
              local_4f8 = local_28[4];
              local_508 = local_28[2];
              uStack_500 = local_28[3];
              _local_518 = CONCAT44(1,(int)*local_28);
              pfStack_510 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish;
              Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                                                ),in_stack_fffffffffffff944,
                                 in_stack_fffffffffffff940);
              Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                                                ),in_stack_fffffffffffff944,
                                 in_stack_fffffffffffff940);
              ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                   ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                   (long)local_4e4);
              (*(*ppLVar5)->_vptr_Layer[7])(*ppLVar5,local_558,local_598,&local_518);
              Mat::~Mat((Mat *)0x13ca30);
              Mat::~Mat((Mat *)0x13ca3d);
            }
          }
          local_398 = 0;
        }
      }
      Mat::~Mat((Mat *)0x13cb75);
      if (local_398 == 0) {
LAB_0013ce43:
        if (in_RDI[1] != 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
        }
        local_4 = 0;
        local_398 = 1;
      }
    }
    else {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                  in_stack_fffffffffffff944,(size_t)in_stack_fffffffffffff938,
                  (Allocator *)in_stack_fffffffffffff930);
      bVar3 = Mat::empty(in_stack_fffffffffffff930);
      pvVar7 = local_20;
      if (!bVar3) {
        if ((*(byte *)(in_RDI + 2) & 1) == 0) {
          lVar2 = *(long *)(*in_RDI + -0x18);
          pcVar6 = local_2e8;
          std::vector<float,_std::allocator<float>_>::vector
                    (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
          (*pcVar6)(local_438 + 0x30,pvVar7,(long)in_RDI + lVar2 + 0x100,
                    (long)in_RDI + lVar2 + 0x140,local_640,local_28);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
        }
        else {
          conv3x3s1_winograd43_int8_sse
                    ((Mat *)top_blob_tm_g._48_8_,(Mat *)top_blob_tm_g._40_8_,
                     (Mat *)top_blob_tm_g.allocator,(Option *)top_blob_tm_g._24_8_);
          for (local_5b4 = 0; local_5b4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80)
              ; local_5b4 = local_5b4 + 1) {
            local_5c8 = local_28[4];
            local_5d8 = local_28[2];
            uStack_5d0 = local_28[3];
            _local_5e8 = CONCAT44(1,(int)*local_28);
            pfStack_5e0 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                               in_stack_fffffffffffff944,in_stack_fffffffffffff940);
            ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d8),(long)local_5b4
                                );
            (*(*ppLVar5)->_vptr_Layer[9])(*ppLVar5,local_628,&local_5e8);
            Mat::~Mat((Mat *)0x13cd41);
          }
        }
        goto LAB_0013ce43;
      }
      local_4 = -100;
      local_398 = 1;
    }
  }
  else {
    local_438._32_8_ = local_28[4];
    local_438._0_8_ = *local_28;
    local_438._16_8_ = local_28[2];
    local_438._24_8_ = local_28[3];
    local_438._8_8_ = local_28[2];
    in_stack_fffffffffffff930 = (Mat *)local_438;
    copy_make_border((Mat *)opt_b_1._0_8_,_hpad_1,opt_b_2._36_4_,opt_b_2._32_4_,opt_b_2._28_4_,
                     opt_b_2._24_4_,(int)opt_b_1.workspace_allocator,
                     opt_b_2.workspace_allocator._4_4_,(Option *)opt_b_1._24_8_);
    bVar3 = Mat::empty(in_stack_fffffffffffff930);
    if (!bVar3) {
      local_2f4 = local_3dc;
      local_2f8 = local_3d8;
      goto LAB_0013c739;
    }
    local_4 = -100;
    local_398 = 1;
  }
LAB_0013d030:
  Mat::~Mat((Mat *)0x13d03d);
LAB_0013d04e:
  Mat::~Mat((Mat *)0x13d05b);
  return local_4;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;  

    if (kernel_size > 7 || stride > 7 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[7][4] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            conv3x3s2_sse,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            conv5x5s2_sse,
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_sse,          
            conv7x7s2_sse,          
            0,
            0
        }  // kernel_size = 7        
    };

    typedef void (*conv_int8_dequant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);
    typedef void (*conv_int8_requant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);

    // kernel_size x stride
    conv_int8_dequant_func conv_int8_dequant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_dequant_sse,
            conv1x1s2_int8_dequant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_dequant_sse,
            conv3x3s2_int8_dequant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_dequant_sse,
            conv5x5s2_int8_dequant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_dequant_sse,          
            conv7x7s2_int8_dequant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_int8_requant_func conv_int8_requant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_requant_sse,
            conv1x1s2_int8_requant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_requant_sse,
            conv3x3s2_int8_requant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_requant_sse,
            conv5x5s2_int8_requant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_requant_sse,          
            conv7x7s2_int8_requant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_func conv = 0;
    conv_int8_dequant_func conv_int8_dequant = 0;
    conv_int8_requant_func conv_int8_requant = 0;

    if (use_int8_inference)
    {
        if (use_int8_requantize)
            conv_int8_requant = conv_int8_requant_func_table[kernel_size-1][stride-1];
        else
            conv_int8_dequant = conv_int8_dequant_func_table[kernel_size-1][stride-1];  
        if ((!conv_int8_requant) && (!conv_int8_dequant))
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    // int8
    if (use_int8_inference)
    {         
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);

                // requantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }
            }
            else
                conv_int8_requant(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);

                // dequantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }
            }
            else
                conv_int8_dequant(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);     
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }        

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;    

    if (use_winograd3x3 && outw >= 8 && outh >=8)
    {
        conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//         conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
    }
    else
        //conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}